

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

float ncnn::reduction<ncnn::reduction_op_sumsq>(float v0,float *ptr,int size,int stride)

{
  int in_EDX;
  int in_ESI;
  float *in_RDI;
  float in_XMM0_Da;
  int i;
  float sum;
  reduction_op_sumsq op;
  int local_24;
  float local_20;
  reduction_op_sumsq local_19;
  int local_18;
  int local_14;
  float *local_10;
  
  local_20 = in_XMM0_Da;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  for (local_24 = 0; local_24 < local_14; local_24 = local_24 + 1) {
    local_20 = reduction_op_sumsq::operator()(&local_19,&local_20,local_10);
    local_10 = local_10 + local_18;
  }
  return local_20;
}

Assistant:

static float reduction(float v0, const float* ptr, int size, int stride)
{
    Op op;

    float sum = v0;
    for (int i = 0; i < size; i++)
    {
        sum = op(sum, *ptr);
        ptr += stride;
    }

    return sum;
}